

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

void iniparser_dumpsection_ini(dictionary *d,char *s,FILE *f)

{
  int iVar1;
  size_t sVar2;
  char *local_448;
  char local_428 [4];
  int seclen;
  char keym [1025];
  int j;
  FILE *f_local;
  char *s_local;
  dictionary *d_local;
  
  if (((d != (dictionary *)0x0) && (f != (FILE *)0x0)) &&
     (unique0x1000015c = (FILE *)f, iVar1 = iniparser_find_entry(d,s), iVar1 != 0)) {
    sVar2 = strlen(s);
    fprintf(stack0xffffffffffffffe0,"\n[%s]\n",s);
    sprintf(local_428,"%s:",s);
    keym[0x3fc] = '\0';
    keym[0x3fd] = '\0';
    keym[0x3fe] = '\0';
    keym[0x3ff] = '\0';
    for (; (long)(int)keym._1020_4_ < d->size; keym._1020_4_ = keym._1020_4_ + 1) {
      if ((d->key[(int)keym._1020_4_] != (char *)0x0) &&
         (iVar1 = strncmp(d->key[(int)keym._1020_4_],local_428,(long)((int)sVar2 + 1)), iVar1 == 0))
      {
        if (d->val[(int)keym._1020_4_] == (char *)0x0) {
          local_448 = "";
        }
        else {
          local_448 = d->val[(int)keym._1020_4_];
        }
        fprintf(stack0xffffffffffffffe0,"%-30s = %s\n",
                d->key[(int)keym._1020_4_] + (long)(int)sVar2 + 1,local_448);
      }
    }
    fprintf(stack0xffffffffffffffe0,"\n");
  }
  return;
}

Assistant:

void iniparser_dumpsection_ini(const dictionary * d, const char * s, FILE * f)
{
    int     j ;
    char    keym[ASCIILINESZ + 1];
    int     seclen ;

    if (d == NULL || f == NULL) return ;
    if (! iniparser_find_entry(d, s)) return ;

    seclen  = (int)strlen(s);
    fprintf(f, "\n[%s]\n", s);
    sprintf(keym, "%s:", s);
    for (j = 0 ; j < d->size ; j++) {
        if (d->key[j] == NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen + 1)) {
            fprintf(f,
                    "%-30s = %s\n",
                    d->key[j] + seclen + 1,
                    d->val[j] ? d->val[j] : "");
        }
    }
    fprintf(f, "\n");
    return ;
}